

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ContinuousAssignSyntax::getChild(ContinuousAssignSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  TokenOrSyntax *in_stack_ffffffffffffff90;
  nullptr_t in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 1:
    token.info = in_stack_ffffffffffffffa0;
    token._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x70),in_stack_ffffffffffffff88);
    break;
  case 5:
    token_00.info = in_stack_ffffffffffffffa0;
    token_00._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax ContinuousAssignSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return assign;
        case 2: return strength;
        case 3: return delay;
        case 4: return &assignments;
        case 5: return semi;
        default: return nullptr;
    }
}